

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O1

int space_mixer_get_out(uint32_t field,uint32_t location,void *buffer,mixed_segment *segment)

{
  int code;
  
  if (field == 0) {
    if (location < *(byte *)((long)segment->data + 0x542c)) {
      *(undefined8 *)buffer =
           *(undefined8 *)(*(long *)((long)segment->data + 0x10) + (ulong)location * 8);
      return 1;
    }
    code = 6;
  }
  else {
    code = 7;
  }
  mixed_err(code);
  return 0;
}

Assistant:

int space_mixer_get_out(uint32_t field, uint32_t location, void *buffer, struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  
  switch(field){
  case MIXED_BUFFER:
    if(data->channels.count <= location){
      mixed_err(MIXED_INVALID_LOCATION);
      return 0;
    }
    *(struct mixed_buffer **)buffer = data->out[location];
    return 1;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}